

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockReturnValueTest.cpp
# Opt level: O0

void __thiscall
TEST_MockReturnValueTest_WhenAConstPointerReturnValueIsExpectedAndAlsoThereIsADefaultShouldlIgnoreTheDefault_Test
::testBody(TEST_MockReturnValueTest_WhenAConstPointerReturnValueIsExpectedAndAlsoThereIsADefaultShouldlIgnoreTheDefault_Test
           *this)

{
  undefined8 uVar1;
  int iVar2;
  MockSupport *pMVar3;
  undefined4 extraout_var;
  UtestShell *pUVar4;
  undefined4 extraout_var_00;
  undefined8 uVar5;
  TestTerminator *pTVar6;
  undefined4 extraout_var_01;
  SimpleString local_80;
  SimpleString local_70;
  SimpleString local_60;
  SimpleString local_50 [2];
  SimpleString local_30;
  undefined8 local_20;
  void *expected_return_value;
  void *default_return_value;
  TEST_MockReturnValueTest_WhenAConstPointerReturnValueIsExpectedAndAlsoThereIsADefaultShouldlIgnoreTheDefault_Test
  *this_local;
  
  expected_return_value = (void *)0x7778;
  local_20 = 0x144010;
  default_return_value = this;
  SimpleString::SimpleString(&local_30,"");
  pMVar3 = mock(&local_30,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(local_50,"foo");
  iVar2 = (*pMVar3->_vptr_MockSupport[3])(pMVar3,local_50);
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x110))
            ((long *)CONCAT44(extraout_var,iVar2),local_20);
  SimpleString::~SimpleString(local_50);
  SimpleString::~SimpleString(&local_30);
  pUVar4 = UtestShell::getCurrent();
  uVar1 = local_20;
  SimpleString::SimpleString(&local_60,"");
  pMVar3 = mock(&local_60,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_70,"foo");
  iVar2 = (*pMVar3->_vptr_MockSupport[6])(pMVar3,&local_70);
  uVar5 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar2) + 0x158))
                    ((long *)CONCAT44(extraout_var_00,iVar2),expected_return_value);
  pTVar6 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[0x13])
            (pUVar4,uVar1,uVar5,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockReturnValueTest.cpp"
             ,0x295,pTVar6);
  SimpleString::~SimpleString(&local_70);
  SimpleString::~SimpleString(&local_60);
  pUVar4 = UtestShell::getCurrent();
  uVar1 = local_20;
  SimpleString::SimpleString(&local_80,"");
  pMVar3 = mock(&local_80,(MockFailureReporter *)0x0);
  iVar2 = (*pMVar3->_vptr_MockSupport[0x1d])(pMVar3,expected_return_value);
  pTVar6 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[0x13])
            (pUVar4,uVar1,CONCAT44(extraout_var_01,iVar2),0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockReturnValueTest.cpp"
             ,0x296,pTVar6);
  SimpleString::~SimpleString(&local_80);
  return;
}

Assistant:

TEST(MockReturnValueTest, WhenAConstPointerReturnValueIsExpectedAndAlsoThereIsADefaultShouldlIgnoreTheDefault)
{
    const void * default_return_value = (void*) 0x7778;
    const void * expected_return_value = (void*) 0x144010;
    mock().expectOneCall("foo").andReturnValue(expected_return_value);
    POINTERS_EQUAL(expected_return_value, mock().actualCall("foo").returnConstPointerValueOrDefault(default_return_value));
    POINTERS_EQUAL(expected_return_value, mock().returnConstPointerValueOrDefault(default_return_value));
}